

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O1

LOs __thiscall Omega_h::invert_fan(Omega_h *this,LOs *a2b)

{
  int *piVar1;
  int iVar2;
  Alloc *pAVar3;
  int iVar4;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *pvVar5;
  long lVar6;
  size_t sVar7;
  _Alloc_hider _Var8;
  undefined8 uVar9;
  LOs LVar10;
  Write<int> b2a;
  type f;
  Write<int> local_78;
  string local_68;
  Write<int> local_48;
  Write<int> local_38;
  
  pAVar3 = (a2b->write_).shared_alloc_.alloc;
  if (((ulong)pAVar3 & 1) == 0) {
    sVar7 = pAVar3->size;
  }
  else {
    sVar7 = (ulong)pAVar3 >> 3;
  }
  iVar4 = Read<int>::last(a2b);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"");
  Write<int>::Write(&local_78,iVar4,-1,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  local_68._M_dataplus._M_p = (pointer)(a2b->write_).shared_alloc_.alloc;
  if (((ulong)local_68._M_dataplus._M_p & 7) == 0 &&
      (Alloc *)local_68._M_dataplus._M_p != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_68._M_dataplus._M_p = (pointer)(((Alloc *)local_68._M_dataplus._M_p)->size * 8 + 1);
    }
    else {
      ((Alloc *)local_68._M_dataplus._M_p)->use_count =
           ((Alloc *)local_68._M_dataplus._M_p)->use_count + 1;
    }
  }
  local_68._M_string_length = (size_type)(a2b->write_).shared_alloc_.direct_ptr;
  local_68.field_2._M_allocated_capacity = (size_type)local_78.shared_alloc_.alloc;
  if (((ulong)local_78.shared_alloc_.alloc & 7) == 0 && local_78.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_68.field_2._M_allocated_capacity = (local_78.shared_alloc_.alloc)->size * 8 + 1;
    }
    else {
      (local_78.shared_alloc_.alloc)->use_count = (local_78.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_68.field_2._8_8_ = local_78.shared_alloc_.direct_ptr;
  _Var8._M_p = local_68._M_dataplus._M_p;
  if (((ulong)local_68._M_dataplus._M_p & 7) == 0 &&
      (Alloc *)local_68._M_dataplus._M_p != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      _Var8._M_p = (pointer)(*(long *)local_68._M_dataplus._M_p * 8 + 1);
    }
    else {
      *(int *)(local_68._M_dataplus._M_p + 0x30) = *(int *)(local_68._M_dataplus._M_p + 0x30) + 1;
    }
  }
  uVar9 = local_68.field_2._M_allocated_capacity;
  if ((local_68.field_2._M_allocated_capacity & 7) == 0 &&
      (Alloc *)local_68.field_2._M_allocated_capacity != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      uVar9 = (Alloc *)(*(long *)local_68.field_2._M_allocated_capacity * 8 + 1);
    }
    else {
      *(int *)(local_68.field_2._M_allocated_capacity + 0x30) =
           *(int *)(local_68.field_2._M_allocated_capacity + 0x30) + 1;
    }
  }
  iVar4 = (int)(sVar7 >> 2);
  if (1 < iVar4) {
    if (((ulong)_Var8._M_p & 7) == 0 && (Alloc *)_Var8._M_p != (Alloc *)0x0) {
      ((Alloc *)_Var8._M_p)->use_count = ((Alloc *)_Var8._M_p)->use_count + -1;
      _Var8._M_p = (pointer)(((Alloc *)_Var8._M_p)->size * 8 + 1);
    }
    if ((uVar9 & 7) == 0 && (Alloc *)uVar9 != (Alloc *)0x0) {
      ((Alloc *)uVar9)->use_count = ((Alloc *)uVar9)->use_count + -1;
      uVar9 = ((Alloc *)uVar9)->size * 8 + 1;
    }
    entering_parallel = '\0';
    lVar6 = 0;
    do {
      iVar2 = *(int *)(local_68._M_string_length + lVar6 * 4);
      if (iVar2 != *(int *)(local_68._M_string_length + lVar6 * 4 + 4)) {
        *(int *)((long)local_78.shared_alloc_.direct_ptr + (long)iVar2 * 4) = (int)lVar6;
      }
      lVar6 = lVar6 + 1;
    } while (iVar4 + -1 != (int)lVar6);
    if ((uVar9 & 7) == 0 && (Alloc *)uVar9 != (Alloc *)0x0) {
      piVar1 = &((Alloc *)uVar9)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)uVar9);
        operator_delete((void *)uVar9,0x48);
      }
    }
    if (((ulong)_Var8._M_p & 7) == 0 && (Alloc *)_Var8._M_p != (Alloc *)0x0) {
      piVar1 = &((Alloc *)_Var8._M_p)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)_Var8._M_p);
        operator_delete(_Var8._M_p,0x48);
      }
    }
    _Var8._M_p = (pointer)0x0;
    uVar9 = (Alloc *)0x0;
  }
  if ((uVar9 & 7) == 0 && (Alloc *)uVar9 != (Alloc *)0x0) {
    piVar1 = &((Alloc *)uVar9)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc((Alloc *)uVar9);
      operator_delete((void *)uVar9,0x48);
    }
  }
  if (((ulong)_Var8._M_p & 7) == 0 && (Alloc *)_Var8._M_p != (Alloc *)0x0) {
    piVar1 = &((Alloc *)_Var8._M_p)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc((Alloc *)_Var8._M_p);
      operator_delete(_Var8._M_p,0x48);
    }
  }
  local_38.shared_alloc_.alloc = local_78.shared_alloc_.alloc;
  if (((ulong)local_78.shared_alloc_.alloc & 7) == 0 && local_78.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_38.shared_alloc_.alloc = (Alloc *)((local_78.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_78.shared_alloc_.alloc)->use_count = (local_78.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_38.shared_alloc_.direct_ptr = local_78.shared_alloc_.direct_ptr;
  fill_right(&local_38);
  pAVar3 = local_38.shared_alloc_.alloc;
  if (((ulong)local_38.shared_alloc_.alloc & 7) == 0 && local_38.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_38.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_38.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  local_48.shared_alloc_.alloc = local_78.shared_alloc_.alloc;
  local_48.shared_alloc_.direct_ptr = local_78.shared_alloc_.direct_ptr;
  if ((((ulong)local_78.shared_alloc_.alloc & 7) == 0 &&
       local_78.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    (local_78.shared_alloc_.alloc)->use_count = (local_78.shared_alloc_.alloc)->use_count + -1;
    local_48.shared_alloc_.alloc = (Alloc *)((local_78.shared_alloc_.alloc)->size * 8 + 1);
  }
  local_78.shared_alloc_.alloc = (Alloc *)0x0;
  local_78.shared_alloc_.direct_ptr = (void *)0x0;
  Read<int>::Read((Read<signed_char> *)this,&local_48);
  pAVar3 = local_48.shared_alloc_.alloc;
  pvVar5 = extraout_RDX;
  if (((ulong)local_48.shared_alloc_.alloc & 7) == 0 && local_48.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_48.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_48.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
      pvVar5 = extraout_RDX_00;
    }
  }
  uVar9 = local_68.field_2._M_allocated_capacity;
  if ((local_68.field_2._M_allocated_capacity & 7) == 0 &&
      (Alloc *)local_68.field_2._M_allocated_capacity != (Alloc *)0x0) {
    piVar1 = (int *)(local_68.field_2._M_allocated_capacity + 0x30);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc((Alloc *)local_68.field_2._M_allocated_capacity);
      operator_delete((void *)uVar9,0x48);
      pvVar5 = extraout_RDX_01;
    }
  }
  _Var8._M_p = local_68._M_dataplus._M_p;
  if (((ulong)local_68._M_dataplus._M_p & 7) == 0 &&
      (Alloc *)local_68._M_dataplus._M_p != (Alloc *)0x0) {
    piVar1 = (int *)(local_68._M_dataplus._M_p + 0x30);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc((Alloc *)local_68._M_dataplus._M_p);
      operator_delete(_Var8._M_p,0x48);
      pvVar5 = extraout_RDX_02;
    }
  }
  pAVar3 = local_78.shared_alloc_.alloc;
  if (((ulong)local_78.shared_alloc_.alloc & 7) == 0 && local_78.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_78.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_78.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
      pvVar5 = extraout_RDX_03;
    }
  }
  LVar10.write_.shared_alloc_.direct_ptr = pvVar5;
  LVar10.write_.shared_alloc_.alloc = (Alloc *)this;
  return (LOs)LVar10.write_.shared_alloc_;
}

Assistant:

LOs invert_fan(LOs a2b) {
  auto na = a2b.size() - 1;
  auto nb = a2b.last();
  Write<LO> b2a(nb, -1);
  auto f = OMEGA_H_LAMBDA(LO a) {
    if (a2b[a] != a2b[a + 1]) b2a[a2b[a]] = a;
  };
  parallel_for(na, f, "invert_fan");
  fill_right(b2a);
  return b2a;
}